

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::RefineEntropyCodes<brotli::Histogram<520>,unsigned_short>
               (unsigned_short *data,size_t length,size_t stride,
               vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *vec)

{
  pointer pHVar1;
  ulong uVar2;
  ulong uVar3;
  size_t iter;
  ulong uVar4;
  uint seed;
  Histogram<520> sample;
  uint local_86c;
  unsigned_short *local_868;
  Histogram<520> local_860;
  
  local_86c = 7;
  uVar2 = ((long)(vec->
                 super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->
                super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x830;
  uVar3 = (length * 2) / stride + uVar2 + 99;
  local_868 = data;
  for (uVar4 = 0; uVar4 < uVar3 - uVar3 % uVar2; uVar4 = uVar4 + 1) {
    memset(&local_860,0,0x828);
    local_860.bit_cost_ = INFINITY;
    RandomSample<brotli::Histogram<520>,unsigned_short>
              (&local_86c,local_868,length,stride,&local_860);
    pHVar1 = (vec->
             super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    Histogram<520>::AddHistogram
              (pHVar1 + uVar4 % (ulong)(((long)(vec->
                                               super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pHVar1) / 0x830),&local_860);
  }
  return;
}

Assistant:

void RefineEntropyCodes(const DataType* data, size_t length,
                        size_t stride,
                        std::vector<HistogramType>* vec) {
  size_t iters =
      kIterMulForRefining * length / stride + kMinItersForRefining;
  unsigned int seed = 7;
  iters = ((iters + vec->size() - 1) / vec->size()) * vec->size();
  for (size_t iter = 0; iter < iters; ++iter) {
    HistogramType sample;
    RandomSample(&seed, data, length, stride, &sample);
    size_t ix = iter % vec->size();
    (*vec)[ix].AddHistogram(sample);
  }
}